

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_visitor.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalOperatorVisitor::VisitOperatorWithProjectionMapChildren
          (LogicalOperatorVisitor *this,LogicalOperator *op)

{
  LogicalOperatorType LVar1;
  reference pvVar2;
  type pLVar3;
  LogicalOrder *pLVar4;
  LogicalFilter *pLVar5;
  NotImplementedException *this_00;
  vector<unsigned_long,_true> *projection_map;
  string local_60;
  string local_40;
  
  LVar1 = op->type;
  if (LVar1 < LOGICAL_DELIM_JOIN) {
    if (LVar1 == LOGICAL_FILTER) {
      pLVar5 = LogicalOperator::Cast<duckdb::LogicalFilter>(op);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar2);
      projection_map = &pLVar5->projection_map;
    }
    else {
      if (LVar1 != LOGICAL_ORDER_BY) goto LAB_00751eba;
      pLVar4 = LogicalOperator::Cast<duckdb::LogicalOrder>(op);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar2);
      projection_map = &pLVar4->projection_map;
    }
  }
  else {
    if ((2 < LVar1 - 0x33) && (LVar1 != LOGICAL_ASOF_JOIN)) {
LAB_00751eba:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"VisitOperatorWithProjectionMapChildren for %s","");
      EnumUtil::ToString<duckdb::LogicalOperatorType>(&local_40,op->type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_00,&local_60,&local_40);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,0);
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(pvVar2);
    VisitChildOfOperatorWithProjectionMap(this,pLVar3,(vector<unsigned_long,_true> *)&op[1].type);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&op->children,1);
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(pvVar2);
    projection_map =
         (vector<unsigned_long,_true> *)
         &op[1].children.
          super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  VisitChildOfOperatorWithProjectionMap(this,pLVar3,projection_map);
  return;
}

Assistant:

void LogicalOperatorVisitor::VisitOperatorWithProjectionMapChildren(LogicalOperator &op) {
	D_ASSERT(op.HasProjectionMap());
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
	case LogicalOperatorType::LOGICAL_ASOF_JOIN: {
		auto &join = op.Cast<LogicalJoin>();
		VisitChildOfOperatorWithProjectionMap(*op.children[0], join.left_projection_map);
		VisitChildOfOperatorWithProjectionMap(*op.children[1], join.right_projection_map);
		break;
	}
	case LogicalOperatorType::LOGICAL_ORDER_BY: {
		auto &order = op.Cast<LogicalOrder>();
		VisitChildOfOperatorWithProjectionMap(*op.children[0], order.projection_map);
		break;
	}
	case LogicalOperatorType::LOGICAL_FILTER: {
		auto &filter = op.Cast<LogicalFilter>();
		VisitChildOfOperatorWithProjectionMap(*op.children[0], filter.projection_map);
		break;
	}
	default:
		throw NotImplementedException("VisitOperatorWithProjectionMapChildren for %s", EnumUtil::ToString(op.type));
	}
}